

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements
          (cmNinjaNormalTargetGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *architectures,string *output)

{
  cmNinjaVars *this_00;
  pointer pbVar1;
  cmLocalNinjaGenerator *this_01;
  cmNinjaNormalTargetGenerator *this_02;
  int iVar2;
  string *psVar3;
  mapped_type *pmVar4;
  cmGeneratedFileStream *pcVar5;
  pointer pbVar6;
  cmOutputConverter *this_03;
  string_view source;
  string_view source_00;
  allocator<char> local_469;
  cmGlobalNinjaGenerator *local_468;
  string linkPath;
  string linkLibs;
  string frameworkPath;
  undefined1 local_400 [16];
  cmNinjaNormalTargetGenerator *local_3f0;
  string local_3e8;
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  string ninjaOutputDir;
  string objectDir;
  key_type local_308;
  cmNinjaDeps explicitDeps;
  cmNinjaBuild dcompile;
  string local_1b0;
  string local_190;
  cmNinjaBuild fatbinary;
  string local_50;
  
  fatbinary.Comment._M_dataplus._M_p = (pointer)&fatbinary.Rule.field_2;
  fatbinary.Comment._M_string_length = 1;
  fatbinary.Comment.field_2._M_allocated_capacity = 0;
  fatbinary.Comment.field_2._8_8_ = 0;
  fatbinary.Rule._M_dataplus._M_p._0_4_ = 0x3f800000;
  fatbinary.Rule._M_string_length = 0;
  fatbinary.Rule.field_2._M_allocated_capacity = 0;
  TargetLinkLanguage(&dcompile.Comment,this,config);
  cmNinjaTargetGenerator::ComputeLinkDeps
            ((cmNinjaDeps *)&linkLineComputer,&this->super_cmNinjaTargetGenerator,&dcompile.Comment,
             config,true);
  std::__cxx11::string::~string((string *)&dcompile);
  cmNinjaTargetGenerator::GetObjects
            ((cmNinjaDeps *)&dcompile,&this->super_cmNinjaTargetGenerator,config);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&fatbinary,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
               _vptr_cmLinkLineComputer,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
               DirectoryState.Tree);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&fatbinary,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )dcompile.Comment._M_dataplus._M_p,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )dcompile.Comment._M_string_length);
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__copy_move<false,false,std::forward_iterator_tag>::
  __copy_m<std::__detail::_Node_iterator<std::__cxx11::string,true,true>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )fatbinary.Comment.field_2._M_allocated_capacity,
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )0x0,&explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&dcompile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&linkLineComputer);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&fatbinary);
  local_468 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            ((string *)&linkLineComputer,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  fatbinary.Comment._M_dataplus._M_p =
       (pointer)linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
                DirectoryState.Tree;
  fatbinary.Comment._M_string_length =
       (size_type)
       linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
       _vptr_cmLinkLineComputer;
  (*(local_468->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49]
  )(&frameworkPath,local_468,config);
  dcompile.Comment._M_dataplus._M_p = (pointer)frameworkPath._M_string_length;
  dcompile.Comment._M_string_length = (size_type)frameworkPath._M_dataplus._M_p;
  cmStrCat<>(&objectDir,(cmAlphaNum *)&fatbinary,(cmAlphaNum *)&dcompile);
  std::__cxx11::string::~string((string *)&frameworkPath);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  psVar3 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,&objectDir);
  std::__cxx11::string::string((string *)&ninjaOutputDir,(string *)psVar3);
  local_3f0 = this;
  LanguageLinkerCudaFatbinaryRule(&local_190,this,config);
  cmNinjaBuild::cmNinjaBuild(&fatbinary,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  pbVar1 = (architectures->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar6 = (architectures->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1) {
    std::__cxx11::string::find((char)pbVar6,0x2d);
    std::__cxx11::string::substr((ulong)&linkPath,(ulong)pbVar6);
    dcompile.Comment._M_dataplus._M_p = (pointer)ninjaOutputDir._M_string_length;
    dcompile.Comment._M_string_length = (size_type)ninjaOutputDir._M_dataplus._M_p;
    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
    _vptr_cmLinkLineComputer = (_func_int **)0x4;
    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState
    .Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)anon_var_dwarf_8a96c4;
    cmStrCat<std::__cxx11::string,char[7]>
              (&linkLibs,(cmAlphaNum *)&dcompile,(cmAlphaNum *)&linkLineComputer,&linkPath,
               (char (*) [7])".cubin");
    LanguageLinkerCudaDeviceRule(&local_50,local_3f0,config);
    cmNinjaBuild::cmNinjaBuild(&dcompile,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&dcompile.ExplicitDeps,&explicitDeps);
    std::__cxx11::string::string((string *)&linkLineComputer,(string *)&linkLibs);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &dcompile.Outputs,&linkLineComputer,
               &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
                Snapshot_.Position);
    std::__cxx11::string::~string((string *)&linkLineComputer);
    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
    _vptr_cmLinkLineComputer = (_func_int **)0x3;
    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState
    .Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x588594;
    frameworkPath._M_dataplus._M_p = (pointer)linkPath._M_string_length;
    frameworkPath._M_string_length = (size_type)linkPath._M_dataplus._M_p;
    cmStrCat<>(&local_3e8,(cmAlphaNum *)&linkLineComputer,(cmAlphaNum *)&frameworkPath);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"ARCH",&local_469);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&dcompile.Variables,&local_308);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_3e8);
    if (fatbinary.ExplicitDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        fatbinary.ExplicitDeps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
      _vptr_cmLinkLineComputer = (_func_int **)0x19;
      linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
      DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x5a8028;
      frameworkPath._M_dataplus._M_p = (pointer)ninjaOutputDir._M_string_length;
      frameworkPath._M_string_length = (size_type)ninjaOutputDir._M_dataplus._M_p;
      cmStrCat<char[23]>(&local_3e8,(cmAlphaNum *)&linkLineComputer,(cmAlphaNum *)&frameworkPath,
                         (char (*) [23])"/cmake_cuda_register.h");
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"REGISTER",&local_469)
      ;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&dcompile.Variables,&local_308);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_3e8);
    }
    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.
    _vptr_cmLinkLineComputer = (_func_int **)&DAT_00000010;
    linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState
    .Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)anon_var_dwarf_8a9726;
    frameworkPath._M_dataplus._M_p = (pointer)linkPath._M_string_length;
    frameworkPath._M_string_length = (size_type)linkPath._M_dataplus._M_p;
    cmStrCat<char[7],std::__cxx11::string>
              (&local_3e8,(cmAlphaNum *)&linkLineComputer,(cmAlphaNum *)&frameworkPath,
               (char (*) [7])",file=",&linkLibs);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"PROFILES",&local_469);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fatbinary.Variables,&local_308);
    std::__cxx11::string::append((string *)pmVar4);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &fatbinary.ExplicitDeps,&linkLibs);
    pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&local_3f0->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::WriteBuild(local_468,(ostream *)pcVar5,&dcompile,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild(&dcompile);
    std::__cxx11::string::~string((string *)&linkLibs);
    std::__cxx11::string::~string((string *)&linkPath);
  }
  dcompile.Comment._M_dataplus._M_p = (pointer)ninjaOutputDir._M_string_length;
  dcompile.Comment._M_string_length = (size_type)ninjaOutputDir._M_dataplus._M_p;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)0x14;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)anon_var_dwarf_8a974a;
  cmStrCat<>(&frameworkPath,(cmAlphaNum *)&dcompile,(cmAlphaNum *)&linkLineComputer);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&fatbinary.Outputs
             ,&frameworkPath,local_400);
  this_02 = local_3f0;
  std::__cxx11::string::~string((string *)&frameworkPath);
  pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&this_02->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(local_468,(ostream *)pcVar5,&fatbinary,0,(bool *)0x0);
  this_01 = (this_02->super_cmNinjaTargetGenerator).LocalGenerator;
  LanguageLinkerCudaDeviceCompileRule(&local_1b0,this_02,config);
  cmNinjaBuild::cmNinjaBuild(&dcompile,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&linkLineComputer,(string *)output);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dcompile.Outputs,
             &linkLineComputer,
             &linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.
              Snapshot_.Position);
  std::__cxx11::string::~string((string *)&linkLineComputer);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)ninjaOutputDir._M_string_length;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
         ninjaOutputDir._M_dataplus._M_p;
  frameworkPath._M_dataplus._M_p = (pointer)0x14;
  frameworkPath._M_string_length = (size_type)anon_var_dwarf_8a974a;
  cmStrCat<>(&linkPath,(cmAlphaNum *)&linkLineComputer,(cmAlphaNum *)&frameworkPath);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &dcompile.ExplicitDeps,&linkPath,&linkLibs);
  std::__cxx11::string::~string((string *)&linkPath);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)objectDir._M_string_length;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)objectDir._M_dataplus._M_p;
  frameworkPath._M_dataplus._M_p = (pointer)0x14;
  frameworkPath._M_string_length = (size_type)anon_var_dwarf_8a974a;
  cmStrCat<>(&linkLibs,(cmAlphaNum *)&linkLineComputer,(cmAlphaNum *)&frameworkPath);
  this_03 = &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  source._M_str = linkLibs._M_dataplus._M_p;
  source._M_len = linkLibs._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&linkPath,this_03,source,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"FATBIN",(allocator<char> *)&local_308);
  this_00 = &dcompile.Variables;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_3e8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&linkPath);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&linkLibs);
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer._vptr_cmLinkLineComputer
       = (_func_int **)objectDir._M_string_length;
  linkLineComputer.super_cmLinkLineDeviceComputer.super_cmLinkLineComputer.StateDir.DirectoryState.
  Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)objectDir._M_dataplus._M_p;
  frameworkPath._M_dataplus._M_p = (pointer)0x16;
  frameworkPath._M_string_length = (size_type)anon_var_dwarf_8a970e;
  cmStrCat<>(&linkLibs,(cmAlphaNum *)&linkLineComputer,(cmAlphaNum *)&frameworkPath);
  source_00._M_str = linkLibs._M_dataplus._M_p;
  source_00._M_len = linkLibs._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&linkPath,this_03,source_00,SHELL);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"REGISTER",(allocator<char> *)&local_308);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_3e8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&linkPath);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&linkLibs);
  if (this_01 == (cmLocalNinjaGenerator *)0x0) {
    this_03 = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&linkPath,(cmLocalGenerator *)this_01);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&frameworkPath,(cmStateSnapshot *)&linkPath);
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            (&linkLineComputer,this_03,(cmStateDirectory *)&frameworkPath,local_468);
  iVar2 = (*(local_468->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[0x26])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)&linkLineComputer,SUB41(iVar2,0));
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath.field_2._M_local_buf[0] = '\0';
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"LINK_FLAGS",(allocator<char> *)&local_308);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_3e8);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)this_01,&linkLineComputer.super_cmLinkLineDeviceComputer,config,
             &linkLibs,pmVar4,&frameworkPath,&linkPath,
             (this_02->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&local_3e8);
  pcVar5 = cmNinjaTargetGenerator::GetCommonFileStream(&this_02->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild(local_468,(ostream *)pcVar5,&dcompile,0,(bool *)0x0);
  std::__cxx11::string::~string((string *)&linkLibs);
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  cmLinkLineDeviceComputer::~cmLinkLineDeviceComputer
            (&linkLineComputer.super_cmLinkLineDeviceComputer);
  cmNinjaBuild::~cmNinjaBuild(&dcompile);
  cmNinjaBuild::~cmNinjaBuild(&fatbinary);
  std::__cxx11::string::~string((string *)&ninjaOutputDir);
  std::__cxx11::string::~string((string *)&objectDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explicitDeps);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements(
  const std::string& config, const std::vector<std::string>& architectures,
  const std::string& output)
{
  // Ensure there are no duplicates.
  const cmNinjaDeps explicitDeps = [&]() -> std::vector<std::string> {
    std::unordered_set<std::string> depsSet;
    const cmNinjaDeps linkDeps =
      this->ComputeLinkDeps(this->TargetLinkLanguage(config), config, true);
    const cmNinjaDeps objects = this->GetObjects(config);
    depsSet.insert(linkDeps.begin(), linkDeps.end());
    depsSet.insert(objects.begin(), objects.end());

    std::vector<std::string> deps;
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  cmGlobalNinjaGenerator* globalGen{ this->GetGlobalGenerator() };
  const std::string objectDir =
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));
  const std::string ninjaOutputDir = this->ConvertToNinjaPath(objectDir);

  cmNinjaBuild fatbinary(this->LanguageLinkerCudaFatbinaryRule(config));

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(ninjaOutputDir, "/sm_", architecture, ".cubin");

    cmNinjaBuild dlink(this->LanguageLinkerCudaDeviceRule(config));
    dlink.ExplicitDeps = explicitDeps;
    dlink.Outputs = { cubin };
    dlink.Variables["ARCH"] = cmStrCat("sm_", architecture);

    // The generated register file contains macros that when expanded register
    // the device routines. Because the routines are the same for all
    // architectures the register file will be the same too. Thus generate it
    // only on the first invocation to reduce overhead.
    if (fatbinary.ExplicitDeps.empty()) {
      dlink.Variables["REGISTER"] = cmStrCat(
        "--register-link-binaries=", ninjaOutputDir, "/cmake_cuda_register.h");
    }

    fatbinary.Variables["PROFILES"] +=
      cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinary.ExplicitDeps.emplace_back(cubin);

    globalGen->WriteBuild(this->GetCommonFileStream(), dlink);
  }

  // Combine all architectures into a single fatbinary.
  fatbinary.Outputs = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  globalGen->WriteBuild(this->GetCommonFileStream(), fatbinary);

  // Compile the stub that registers the kernels and contains the fatbinaries.
  cmLocalNinjaGenerator* localGen{ this->GetLocalGenerator() };
  cmNinjaBuild dcompile(this->LanguageLinkerCudaDeviceCompileRule(config));
  dcompile.Outputs = { output };
  dcompile.ExplicitDeps = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  dcompile.Variables["FATBIN"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_fatbin.h"), cmOutputConverter::SHELL);
  dcompile.Variables["REGISTER"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_register.h"), cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    localGen, localGen->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  // Link libraries and paths are only used during the final executable/library
  // link.
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  localGen->GetDeviceLinkFlags(linkLineComputer, config, linkLibs,
                               dcompile.Variables["LINK_FLAGS"], frameworkPath,
                               linkPath, this->GetGeneratorTarget());

  globalGen->WriteBuild(this->GetCommonFileStream(), dcompile);
}